

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityDamageStatusPdu.cpp
# Opt level: O0

void __thiscall
DIS::EntityDamageStatusPdu::marshal(EntityDamageStatusPdu *this,DataStream *dataStream)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 local_80 [8];
  DirectedEnergyDamage x;
  size_t idx;
  DataStream *dataStream_local;
  EntityDamageStatusPdu *this_local;
  
  WarfareFamilyPdu::marshal(&this->super_WarfareFamilyPdu,dataStream);
  EntityID::marshal(&this->_damagedEntityID,dataStream);
  DataStream::operator<<(dataStream,this->_padding1);
  DataStream::operator<<(dataStream,this->_padding2);
  sVar2 = std::vector<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>::size
                    (&this->_damageDescriptionRecords);
  DataStream::operator<<(dataStream,(unsigned_short)sVar2);
  x._padding2 = 0;
  x._90_6_ = 0;
  while( true ) {
    uVar1 = x._88_8_;
    sVar2 = std::vector<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>::size
                      (&this->_damageDescriptionRecords);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::vector<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>::
             operator[](&this->_damageDescriptionRecords,x._88_8_);
    DirectedEnergyDamage::DirectedEnergyDamage((DirectedEnergyDamage *)local_80,pvVar3);
    DirectedEnergyDamage::marshal((DirectedEnergyDamage *)local_80,dataStream);
    DirectedEnergyDamage::~DirectedEnergyDamage((DirectedEnergyDamage *)local_80);
    x._88_8_ = x._88_8_ + 1;
  }
  return;
}

Assistant:

void EntityDamageStatusPdu::marshal(DataStream& dataStream) const
{
    WarfareFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _damagedEntityID.marshal(dataStream);
    dataStream << _padding1;
    dataStream << _padding2;
    dataStream << ( unsigned short )_damageDescriptionRecords.size();

     for(size_t idx = 0; idx < _damageDescriptionRecords.size(); idx++)
     {
        DirectedEnergyDamage x = _damageDescriptionRecords[idx];
        x.marshal(dataStream);
     }

}